

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * FixPath_abi_cxx11_(string *__return_storage_ptr__,CStringRef path,char sep)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char local_13;
  char local_12;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,path.data_,&local_11);
  if (sep != '/') {
    __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + __return_storage_ptr__->_M_string_length),&local_12,
               &local_13);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixPath(fmt::CStringRef path, char sep) {
  std::string fixed(path.c_str());
  if (sep != '/')
    std::replace(fixed.begin(), fixed.end(), '/', sep);
  return fixed;
}